

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

int Extra_zddLitCountComb(DdManager *dd,DdNode *zComb)

{
  int local_24;
  DdNode *pDStack_20;
  int Counter;
  DdNode *zComb_local;
  DdManager *dd_local;
  
  if (zComb == dd->zero) {
    dd_local._4_4_ = 0;
  }
  else {
    local_24 = 0;
    for (pDStack_20 = zComb; pDStack_20 != dd->one; pDStack_20 = (pDStack_20->type).kids.T) {
      local_24 = local_24 + 1;
    }
    dd_local._4_4_ = local_24;
  }
  return dd_local._4_4_;
}

Assistant:

int Extra_zddLitCountComb( DdManager * dd, DdNode * zComb )
{
	int Counter;
	if ( zComb == z0 )
		return 0;
	Counter = 0;
	for ( ; zComb != z1; zComb = cuddT(zComb) )
		Counter++;
	return Counter;
}